

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O1

Object * ICM::Run(InstructionList *instlist,ElementPool *EP)

{
  Object *pOVar1;
  Interpreter interpreter;
  allocator_type local_71;
  value_type local_70;
  Interpreter local_68;
  
  local_68.Result = (Object *)(Static + 0x10);
  local_70 = (value_type)Static;
  local_68.InstList = instlist;
  std::vector<ICM::Object_*,_std::allocator<ICM::Object_*>_>::vector
            (&local_68.TempResult,
             (long)(instlist->
                   super_vector<ICM::Instruction::InstructionData_*,_std::allocator<ICM::Instruction::InstructionData_*>_>
                   ).
                   super__Vector_base<ICM::Instruction::InstructionData_*,_std::allocator<ICM::Instruction::InstructionData_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(instlist->
                   super_vector<ICM::Instruction::InstructionData_*,_std::allocator<ICM::Instruction::InstructionData_*>_>
                   ).
                   super__Vector_base<ICM::Instruction::InstructionData_*,_std::allocator<ICM::Instruction::InstructionData_*>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3,&local_70,&local_71);
  local_68.Global.Func.Func.subid = 0xffffffffffffffff;
  local_68.Global.Func.Args._capacity = 0;
  local_68.Global.Func.Args._data.super___shared_ptr<ICM::Object_*,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  local_68.Global.Func.Args._data.super___shared_ptr<ICM::Object_*,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_68.EP = EP;
  pOVar1 = Interpreter::run(&local_68);
  if (local_68.Global.Func.Args._data.super___shared_ptr<ICM::Object_*,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_68.Global.Func.Args._data.
               super___shared_ptr<ICM::Object_*,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_68.TempResult.super__Vector_base<ICM::Object_*,_std::allocator<ICM::Object_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.TempResult.
                    super__Vector_base<ICM::Object_*,_std::allocator<ICM::Object_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_68.TempResult.
                          super__Vector_base<ICM::Object_*,_std::allocator<ICM::Object_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.TempResult.
                          super__Vector_base<ICM::Object_*,_std::allocator<ICM::Object_*>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return pOVar1;
}

Assistant:

Interpreter(Instruction::InstructionList &InstList, const Compiler::ElementPool &EP)
			: InstList(InstList), TempResult(InstList.size(), &Static.Null), EP(EP) {}